

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_vsnprintf(int n,char *zBuf,char *zFormat,__va_list_tag *ap)

{
  StrAccum acc;
  StrAccum local_38;
  
  if (0 < n) {
    local_38.db = (sqlite3 *)0x0;
    local_38.nChar = 0;
    local_38.mxAlloc = 0;
    local_38.accError = '\0';
    local_38.printfFlags = '\0';
    local_38.zBase = zBuf;
    local_38.zText = zBuf;
    local_38.nAlloc = n;
    sqlite3VXPrintf(&local_38,zFormat,ap);
    zBuf[local_38.nChar] = '\0';
  }
  return zBuf;
}

Assistant:

SQLITE_API char *sqlite3_vsnprintf(int n, char *zBuf, const char *zFormat, va_list ap){
  StrAccum acc;
  if( n<=0 ) return zBuf;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( zBuf==0 || zFormat==0 ) {
    (void)SQLITE_MISUSE_BKPT;
    if( zBuf ) zBuf[0] = 0;
    return zBuf;
  }
#endif
  sqlite3StrAccumInit(&acc, 0, zBuf, n, 0);
  sqlite3VXPrintf(&acc, zFormat, ap);
  zBuf[acc.nChar] = 0;
  return zBuf;
}